

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  BBox1f BVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  int iVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  Geometry *pGVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  bool bVar44;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar45;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar57;
  float fVar66;
  float fVar67;
  vint4 ai;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar68;
  undefined1 auVar65 [32];
  vint4 bi;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  vint4 ai_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  vint4 bi_1;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  vint4 bi_7;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  float fVar116;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar125;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar123;
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [64];
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  float fVar137;
  undefined1 auVar133 [32];
  float fVar135;
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar134 [64];
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  float fVar155;
  float fVar159;
  float fVar160;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar162;
  float fVar165;
  float fVar166;
  undefined1 auVar163 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  float old_t;
  vint4 bi_5;
  vint4 bi_2;
  RTCFilterFunctionNArguments args;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack [244];
  undefined1 local_e61;
  size_t local_e60;
  RayK<8> *local_e58;
  uint local_e50;
  uint local_e4c;
  ulong local_e48;
  undefined1 local_e40 [32];
  undefined1 local_e20 [32];
  Geometry *local_e00;
  undefined1 auStack_df8 [24];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined1 local_db0 [16];
  ulong local_d98;
  ulong local_d90;
  long local_d88;
  long local_d80;
  long local_d78;
  ulong *local_d70;
  ulong local_d68;
  long local_d60;
  long local_d58;
  Scene *local_d50;
  ulong local_d48;
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [16];
  float local_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float local_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float local_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  RTCFilterFunctionNArguments local_c30;
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 *local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  float local_980 [4];
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined4 uStack_964;
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_d70 = local_7f8;
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_c40._4_4_ = uVar1;
  local_c40._0_4_ = uVar1;
  local_c40._8_4_ = uVar1;
  local_c40._12_4_ = uVar1;
  auVar122 = ZEXT1664(local_c40);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_c50._4_4_ = uVar1;
  local_c50._0_4_ = uVar1;
  local_c50._8_4_ = uVar1;
  local_c50._12_4_ = uVar1;
  auVar134 = ZEXT1664(local_c50);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_db0._4_4_ = uVar1;
  local_db0._0_4_ = uVar1;
  local_db0._8_4_ = uVar1;
  local_db0._12_4_ = uVar1;
  auVar109 = ZEXT1664(local_db0);
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar57 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar67 = fVar45 * 0.99999964;
  fVar68 = fVar57 * 0.99999964;
  fVar69 = fVar66 * 0.99999964;
  fVar45 = fVar45 * 1.0000004;
  fVar57 = fVar57 * 1.0000004;
  fVar66 = fVar66 * 1.0000004;
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_d48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar40 = uVar39 ^ 0x10;
  uVar42 = local_d48 ^ 0x10;
  iVar27 = (tray->tnear).field_0.i[k];
  local_cc0._4_4_ = iVar27;
  local_cc0._0_4_ = iVar27;
  local_cc0._8_4_ = iVar27;
  local_cc0._12_4_ = iVar27;
  auVar101 = ZEXT1664(local_cc0);
  iVar27 = (tray->tfar).field_0.i[k];
  local_cd0._4_4_ = iVar27;
  local_cd0._0_4_ = iVar27;
  local_cd0._8_4_ = iVar27;
  local_cd0._12_4_ = iVar27;
  auVar176 = ZEXT1664(local_cd0);
  local_b00._16_16_ = mm_lookupmask_ps._240_16_;
  local_b00._0_16_ = mm_lookupmask_ps._0_16_;
  iVar27 = 1 << ((uint)k & 0x1f);
  auVar51._4_4_ = iVar27;
  auVar51._0_4_ = iVar27;
  auVar51._8_4_ = iVar27;
  auVar51._12_4_ = iVar27;
  auVar51._16_4_ = iVar27;
  auVar51._20_4_ = iVar27;
  auVar51._24_4_ = iVar27;
  auVar51._28_4_ = iVar27;
  auVar52 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar51 = vpand_avx2(auVar51,auVar52);
  local_b60 = vpcmpeqd_avx2(auVar51,auVar52);
  bVar44 = true;
  auVar61._8_4_ = 0x3f800000;
  auVar61._0_8_ = 0x3f8000003f800000;
  auVar61._12_4_ = 0x3f800000;
  auVar61._16_4_ = 0x3f800000;
  auVar61._20_4_ = 0x3f800000;
  auVar61._24_4_ = 0x3f800000;
  auVar61._28_4_ = 0x3f800000;
  auVar52._8_4_ = 0xbf800000;
  auVar52._0_8_ = 0xbf800000bf800000;
  auVar52._12_4_ = 0xbf800000;
  auVar52._16_4_ = 0xbf800000;
  auVar52._20_4_ = 0xbf800000;
  auVar52._24_4_ = 0xbf800000;
  auVar52._28_4_ = 0xbf800000;
  _local_b20 = vblendvps_avx(auVar61,auVar52,local_b00);
  fVar70 = fVar66;
  fVar71 = fVar66;
  fVar116 = fVar66;
  fVar144 = fVar67;
  fVar145 = fVar67;
  fVar146 = fVar67;
  fVar152 = fVar68;
  fVar153 = fVar68;
  fVar154 = fVar68;
  fVar117 = fVar69;
  fVar123 = fVar69;
  fVar124 = fVar69;
  fVar125 = fVar45;
  fVar126 = fVar45;
  fVar127 = fVar45;
  fVar128 = fVar57;
  fVar129 = fVar57;
  fVar135 = fVar57;
  local_e60 = k;
  local_e58 = ray;
  local_d90 = uVar39;
  local_cb0 = fVar66;
  fStack_cac = fVar66;
  fStack_ca8 = fVar66;
  fStack_ca4 = fVar66;
  local_ca0 = fVar57;
  fStack_c9c = fVar57;
  fStack_c98 = fVar57;
  fStack_c94 = fVar57;
  local_c90 = fVar45;
  fStack_c8c = fVar45;
  fStack_c88 = fVar45;
  fStack_c84 = fVar45;
  local_c80 = fVar69;
  fStack_c7c = fVar69;
  fStack_c78 = fVar69;
  fStack_c74 = fVar69;
  local_c70 = fVar68;
  fStack_c6c = fVar68;
  fStack_c68 = fVar68;
  fStack_c64 = fVar68;
  local_c60 = fVar67;
  fStack_c5c = fVar67;
  fStack_c58 = fVar67;
  fStack_c54 = fVar67;
  do {
    uVar41 = local_d70[-1];
    local_d70 = local_d70 + -1;
    while ((uVar41 & 8) == 0) {
      uVar28 = uVar41 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar46._4_4_ = uVar1;
      auVar46._0_4_ = uVar1;
      auVar46._8_4_ = uVar1;
      auVar46._12_4_ = uVar1;
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + uVar39),auVar46,
                                *(undefined1 (*) [16])(uVar28 + 0x20 + uVar39));
      auVar47 = vsubps_avx(auVar47,auVar122._0_16_);
      auVar58._0_4_ = fVar67 * auVar47._0_4_;
      auVar58._4_4_ = fVar144 * auVar47._4_4_;
      auVar58._8_4_ = fVar145 * auVar47._8_4_;
      auVar58._12_4_ = fVar146 * auVar47._12_4_;
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + local_d48),auVar46,
                                *(undefined1 (*) [16])(uVar28 + 0x20 + local_d48));
      auVar47 = vsubps_avx(auVar47,auVar134._0_16_);
      auVar72._0_4_ = fVar68 * auVar47._0_4_;
      auVar72._4_4_ = fVar152 * auVar47._4_4_;
      auVar72._8_4_ = fVar153 * auVar47._8_4_;
      auVar72._12_4_ = fVar154 * auVar47._12_4_;
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + uVar35),auVar46,
                                *(undefined1 (*) [16])(uVar28 + 0x20 + uVar35));
      auVar47 = vsubps_avx(auVar47,auVar109._0_16_);
      auVar80._0_4_ = fVar69 * auVar47._0_4_;
      auVar80._4_4_ = fVar117 * auVar47._4_4_;
      auVar80._8_4_ = fVar123 * auVar47._8_4_;
      auVar80._12_4_ = fVar124 * auVar47._12_4_;
      auVar47 = vmaxps_avx(auVar72,auVar80);
      auVar58 = vmaxps_avx(auVar101._0_16_,auVar58);
      auVar47 = vmaxps_avx(auVar58,auVar47);
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + uVar40),auVar46,
                                *(undefined1 (*) [16])(uVar28 + 0x20 + uVar40));
      auVar58 = vsubps_avx(auVar58,auVar122._0_16_);
      auVar73._0_4_ = fVar45 * auVar58._0_4_;
      auVar73._4_4_ = fVar125 * auVar58._4_4_;
      auVar73._8_4_ = fVar126 * auVar58._8_4_;
      auVar73._12_4_ = fVar127 * auVar58._12_4_;
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + uVar42),auVar46,
                                *(undefined1 (*) [16])(uVar28 + 0x20 + uVar42));
      auVar58 = vsubps_avx(auVar58,auVar134._0_16_);
      auVar72 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + (uVar35 ^ 0x10)),auVar46,
                                *(undefined1 (*) [16])(uVar28 + 0x20 + (uVar35 ^ 0x10)));
      auVar81._0_4_ = fVar57 * auVar58._0_4_;
      auVar81._4_4_ = fVar128 * auVar58._4_4_;
      auVar81._8_4_ = fVar129 * auVar58._8_4_;
      auVar81._12_4_ = fVar135 * auVar58._12_4_;
      auVar58 = vsubps_avx(auVar72,auVar109._0_16_);
      auVar87._0_4_ = fVar66 * auVar58._0_4_;
      auVar87._4_4_ = fVar70 * auVar58._4_4_;
      auVar87._8_4_ = fVar71 * auVar58._8_4_;
      auVar87._12_4_ = fVar116 * auVar58._12_4_;
      auVar58 = vminps_avx(auVar81,auVar87);
      auVar72 = vminps_avx(auVar176._0_16_,auVar73);
      auVar58 = vminps_avx(auVar72,auVar58);
      if (((uint)uVar41 & 7) == 6) {
        auVar58 = vcmpps_avx(auVar47,auVar58,2);
        auVar47 = vcmpps_avx(*(undefined1 (*) [16])(uVar28 + 0xe0),auVar46,2);
        auVar72 = vcmpps_avx(auVar46,*(undefined1 (*) [16])(uVar28 + 0xf0),1);
        auVar47 = vandps_avx(auVar47,auVar72);
        auVar47 = vandps_avx(auVar47,auVar58);
      }
      else {
        auVar47 = vcmpps_avx(auVar47,auVar58,2);
      }
      auVar47 = vpslld_avx(auVar47,0x1f);
      uVar32 = vmovmskps_avx(auVar47);
      if (uVar32 == 0) goto LAB_0059fafe;
      uVar32 = uVar32 & 0xff;
      lVar33 = 0;
      for (uVar41 = (ulong)uVar32; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
        lVar33 = lVar33 + 1;
      }
      uVar41 = *(ulong *)(uVar28 + lVar33 * 8);
      uVar32 = uVar32 - 1 & uVar32;
      uVar36 = (ulong)uVar32;
      if (uVar32 != 0) {
        *local_d70 = uVar41;
        lVar33 = 0;
        for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
          lVar33 = lVar33 + 1;
        }
        uVar32 = uVar32 - 1 & uVar32;
        uVar36 = (ulong)uVar32;
        bVar43 = uVar32 == 0;
        while( true ) {
          local_d70 = local_d70 + 1;
          uVar41 = *(ulong *)(uVar28 + lVar33 * 8);
          if (bVar43) break;
          *local_d70 = uVar41;
          lVar33 = 0;
          for (uVar41 = uVar36; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
            lVar33 = lVar33 + 1;
          }
          uVar36 = uVar36 - 1 & uVar36;
          bVar43 = uVar36 == 0;
        }
      }
    }
    local_d78 = (ulong)((uint)uVar41 & 0xf) - 8;
    if (local_d78 != 0) {
      uVar41 = uVar41 & 0xfffffffffffffff0;
      local_d80 = 0;
      do {
        local_d88 = local_d80 * 0x90;
        uVar28 = *(ulong *)(uVar41 + 0x20 + local_d88);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = uVar28;
        auVar47 = vpmovzxbd_avx(auVar48);
        auVar47 = vcvtdq2ps_avx(auVar47);
        uVar1 = *(undefined4 *)(uVar41 + 0x44 + local_d88);
        auVar95._4_4_ = uVar1;
        auVar95._0_4_ = uVar1;
        auVar95._8_4_ = uVar1;
        auVar95._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(uVar41 + 0x38 + local_d88);
        auVar102._4_4_ = uVar1;
        auVar102._0_4_ = uVar1;
        auVar102._8_4_ = uVar1;
        auVar102._12_4_ = uVar1;
        auVar72 = vfmadd213ps_fma(auVar47,auVar95,auVar102);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)(uVar41 + 0x50 + local_d88);
        auVar47 = vpmovzxbd_avx(auVar47);
        auVar47 = vcvtdq2ps_avx(auVar47);
        uVar1 = *(undefined4 *)(uVar41 + 0x74 + local_d88);
        auVar110._4_4_ = uVar1;
        auVar110._0_4_ = uVar1;
        auVar110._8_4_ = uVar1;
        auVar110._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(uVar41 + 0x68 + local_d88);
        auVar118._4_4_ = uVar1;
        auVar118._0_4_ = uVar1;
        auVar118._8_4_ = uVar1;
        auVar118._12_4_ = uVar1;
        auVar46 = vfmadd213ps_fma(auVar47,auVar110,auVar118);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)(uVar41 + 0x24 + local_d88);
        auVar47 = vpmovzxbd_avx(auVar59);
        auVar47 = vcvtdq2ps_avx(auVar47);
        auVar73 = vfmadd213ps_fma(auVar47,auVar95,auVar102);
        auVar96._8_8_ = 0;
        auVar96._0_8_ = *(ulong *)(uVar41 + 0x54 + local_d88);
        auVar47 = vpmovzxbd_avx(auVar96);
        auVar47 = vcvtdq2ps_avx(auVar47);
        auVar80 = vfmadd213ps_fma(auVar47,auVar110,auVar118);
        auVar103._8_8_ = 0;
        auVar103._0_8_ = *(ulong *)(uVar41 + 0x28 + local_d88);
        auVar47 = vpmovzxbd_avx(auVar103);
        auVar47 = vcvtdq2ps_avx(auVar47);
        uVar1 = *(undefined4 *)(uVar41 + 0x48 + local_d88);
        auVar130._4_4_ = uVar1;
        auVar130._0_4_ = uVar1;
        auVar130._8_4_ = uVar1;
        auVar130._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(uVar41 + 0x3c + local_d88);
        auVar141._4_4_ = uVar1;
        auVar141._0_4_ = uVar1;
        auVar141._8_4_ = uVar1;
        auVar141._12_4_ = uVar1;
        auVar81 = vfmadd213ps_fma(auVar47,auVar130,auVar141);
        auVar111._8_8_ = 0;
        auVar111._0_8_ = *(ulong *)(uVar41 + 0x58 + local_d88);
        auVar47 = vpmovzxbd_avx(auVar111);
        auVar47 = vcvtdq2ps_avx(auVar47);
        uVar1 = *(undefined4 *)(uVar41 + 0x78 + local_d88);
        auVar147._4_4_ = uVar1;
        auVar147._0_4_ = uVar1;
        auVar147._8_4_ = uVar1;
        auVar147._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(uVar41 + 0x6c + local_d88);
        auVar156._4_4_ = uVar1;
        auVar156._0_4_ = uVar1;
        auVar156._8_4_ = uVar1;
        auVar156._12_4_ = uVar1;
        auVar87 = vfmadd213ps_fma(auVar47,auVar147,auVar156);
        auVar119._8_8_ = 0;
        auVar119._0_8_ = *(ulong *)(uVar41 + 0x2c + local_d88);
        auVar47 = vpmovzxbd_avx(auVar119);
        auVar47 = vcvtdq2ps_avx(auVar47);
        auVar49 = vfmadd213ps_fma(auVar47,auVar130,auVar141);
        auVar131._8_8_ = 0;
        auVar131._0_8_ = *(ulong *)(uVar41 + 0x5c + local_d88);
        auVar47 = vpmovzxbd_avx(auVar131);
        auVar47 = vcvtdq2ps_avx(auVar47);
        auVar60 = vfmadd213ps_fma(auVar47,auVar147,auVar156);
        auVar142._8_8_ = 0;
        auVar142._0_8_ = *(ulong *)(uVar41 + 0x30 + local_d88);
        auVar47 = vpmovzxbd_avx(auVar142);
        auVar47 = vcvtdq2ps_avx(auVar47);
        uVar1 = *(undefined4 *)(uVar41 + 0x4c + local_d88);
        auVar148._4_4_ = uVar1;
        auVar148._0_4_ = uVar1;
        auVar148._8_4_ = uVar1;
        auVar148._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(uVar41 + 0x40 + local_d88);
        auVar157._4_4_ = uVar1;
        auVar157._0_4_ = uVar1;
        auVar157._8_4_ = uVar1;
        auVar157._12_4_ = uVar1;
        auVar74 = vfmadd213ps_fma(auVar47,auVar148,auVar157);
        auVar163._8_8_ = 0;
        auVar163._0_8_ = *(ulong *)(uVar41 + 0x60 + local_d88);
        auVar47 = vpmovzxbd_avx(auVar163);
        auVar47 = vcvtdq2ps_avx(auVar47);
        uVar1 = *(undefined4 *)(uVar41 + 0x7c + local_d88);
        auVar171._4_4_ = uVar1;
        auVar171._0_4_ = uVar1;
        auVar171._8_4_ = uVar1;
        auVar171._12_4_ = uVar1;
        auVar173._8_8_ = 0;
        auVar173._0_8_ = *(ulong *)(uVar41 + 0x34 + local_d88);
        auVar58 = vpmovzxbd_avx(auVar173);
        auVar58 = vcvtdq2ps_avx(auVar58);
        auVar58 = vfmadd213ps_fma(auVar58,auVar148,auVar157);
        uVar1 = *(undefined4 *)(uVar41 + 0x70 + local_d88);
        auVar149._4_4_ = uVar1;
        auVar149._0_4_ = uVar1;
        auVar149._8_4_ = uVar1;
        auVar149._12_4_ = uVar1;
        auVar82 = vfmadd213ps_fma(auVar47,auVar171,auVar149);
        auVar158._8_8_ = 0;
        auVar158._0_8_ = *(ulong *)(uVar41 + 100 + local_d88);
        auVar47 = vpmovzxbd_avx(auVar158);
        auVar47 = vcvtdq2ps_avx(auVar47);
        auVar88 = vfmadd213ps_fma(auVar47,auVar171,auVar149);
        fVar45 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(uVar41 + 0x80 + local_d88)) *
                 *(float *)(uVar41 + 0x84 + local_d88);
        auVar150._4_4_ = fVar45;
        auVar150._0_4_ = fVar45;
        auVar150._8_4_ = fVar45;
        auVar150._12_4_ = fVar45;
        auVar47 = vsubps_avx(auVar46,auVar72);
        auVar72 = vfmadd213ps_fma(auVar47,auVar150,auVar72);
        auVar47 = vsubps_avx(auVar80,auVar73);
        auVar46 = vfmadd213ps_fma(auVar47,auVar150,auVar73);
        auVar47 = vsubps_avx(auVar87,auVar81);
        auVar73 = vfmadd213ps_fma(auVar47,auVar150,auVar81);
        auVar47 = vsubps_avx(auVar60,auVar49);
        auVar80 = vfmadd213ps_fma(auVar47,auVar150,auVar49);
        auVar47 = vsubps_avx(auVar82,auVar74);
        auVar81 = vfmadd213ps_fma(auVar47,auVar150,auVar74);
        auVar47 = vsubps_avx(auVar88,auVar58);
        auVar87 = vfmadd213ps_fma(auVar47,auVar150,auVar58);
        auVar47 = vpminub_avx(auVar48,auVar59);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = uVar28;
        auVar47 = vpcmpeqb_avx(auVar49,auVar47);
        auVar58 = vsubps_avx(auVar72,local_c40);
        auVar60._0_4_ = local_c60 * auVar58._0_4_;
        auVar60._4_4_ = fStack_c5c * auVar58._4_4_;
        auVar60._8_4_ = fStack_c58 * auVar58._8_4_;
        auVar60._12_4_ = fStack_c54 * auVar58._12_4_;
        auVar58 = vsubps_avx(auVar73,local_c50);
        auVar82._0_4_ = local_c70 * auVar58._0_4_;
        auVar82._4_4_ = fStack_c6c * auVar58._4_4_;
        auVar82._8_4_ = fStack_c68 * auVar58._8_4_;
        auVar82._12_4_ = fStack_c64 * auVar58._12_4_;
        auVar58 = vsubps_avx(auVar46,local_c40);
        auVar74._0_4_ = local_c90 * auVar58._0_4_;
        auVar74._4_4_ = fStack_c8c * auVar58._4_4_;
        auVar74._8_4_ = fStack_c88 * auVar58._8_4_;
        auVar74._12_4_ = fStack_c84 * auVar58._12_4_;
        auVar58 = vsubps_avx(auVar80,local_c50);
        auVar88._0_4_ = local_ca0 * auVar58._0_4_;
        auVar88._4_4_ = fStack_c9c * auVar58._4_4_;
        auVar88._8_4_ = fStack_c98 * auVar58._8_4_;
        auVar88._12_4_ = fStack_c94 * auVar58._12_4_;
        auVar72 = vpminsd_avx(auVar60,auVar74);
        auVar58 = vpmaxsd_avx(auVar60,auVar74);
        auVar46 = vpminsd_avx(auVar82,auVar88);
        auVar72 = vpmaxsd_avx(auVar72,auVar46);
        auVar46 = vpmaxsd_avx(auVar82,auVar88);
        auVar73 = vsubps_avx(auVar81,local_db0);
        auVar89._0_4_ = local_c80 * auVar73._0_4_;
        auVar89._4_4_ = fStack_c7c * auVar73._4_4_;
        auVar89._8_4_ = fStack_c78 * auVar73._8_4_;
        auVar89._12_4_ = fStack_c74 * auVar73._12_4_;
        auVar73 = vsubps_avx(auVar87,local_db0);
        auVar97._0_4_ = local_cb0 * auVar73._0_4_;
        auVar97._4_4_ = fStack_cac * auVar73._4_4_;
        auVar97._8_4_ = fStack_ca8 * auVar73._8_4_;
        auVar97._12_4_ = fStack_ca4 * auVar73._12_4_;
        auVar73 = vpminsd_avx(auVar58,auVar46);
        auVar46 = vpminsd_avx(auVar89,auVar97);
        auVar58 = vpmaxsd_avx(auVar89,auVar97);
        auVar46 = vpmaxsd_avx(auVar46,local_cc0);
        auVar72 = vpmaxsd_avx(auVar72,auVar46);
        auVar58 = vpminsd_avx(auVar58,local_cd0);
        auVar58 = vpminsd_avx(auVar73,auVar58);
        auVar58 = vpcmpgtd_avx(auVar72,auVar58);
        auVar47 = vpmovsxbd_avx(auVar47);
        auVar47 = vpandn_avx(auVar58,auVar47);
        uVar32 = vmovmskps_avx(auVar47);
        if (uVar32 != 0) {
          local_d88 = local_d88 + uVar41;
          local_d68 = (ulong)(uVar32 & 0xff);
          do {
            lVar33 = 0;
            for (uVar39 = local_d68; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
              lVar33 = lVar33 + 1;
            }
            uVar3 = *(ushort *)(local_d88 + lVar33 * 8);
            uVar4 = *(ushort *)(local_d88 + 2 + lVar33 * 8);
            local_de0._4_4_ = *(uint *)(local_d88 + 0x88);
            local_e48 = (ulong)local_de0._4_4_;
            local_d00._4_4_ = *(uint *)(local_d88 + 4 + lVar33 * 8);
            local_d98 = (ulong)local_d00._4_4_;
            local_d50 = context->scene;
            pGVar38 = (local_d50->geometries).items[local_e48].ptr;
            local_d58 = *(long *)&pGVar38->field_0x58;
            BVar2 = pGVar38->time_range;
            auVar50._8_8_ = 0;
            auVar50._0_4_ = BVar2.lower;
            auVar50._4_4_ = BVar2.upper;
            fVar45 = BVar2.lower;
            auVar62._4_4_ = fVar45;
            auVar62._0_4_ = fVar45;
            auVar62._8_4_ = fVar45;
            auVar62._12_4_ = fVar45;
            auVar62._16_4_ = fVar45;
            auVar62._20_4_ = fVar45;
            auVar62._24_4_ = fVar45;
            auVar62._28_4_ = fVar45;
            fVar45 = pGVar38->fnumTimeSegments;
            auVar51 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar62);
            auVar47 = vmovshdup_avx(auVar50);
            auVar47 = vsubps_avx(auVar47,auVar50);
            auVar53._0_4_ = auVar47._0_4_;
            auVar53._4_4_ = auVar53._0_4_;
            auVar53._8_4_ = auVar53._0_4_;
            auVar53._12_4_ = auVar53._0_4_;
            auVar53._16_4_ = auVar53._0_4_;
            auVar53._20_4_ = auVar53._0_4_;
            auVar53._24_4_ = auVar53._0_4_;
            auVar53._28_4_ = auVar53._0_4_;
            auVar51 = vdivps_avx(auVar51,auVar53);
            local_d60 = pGVar38[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                        * local_d98;
            auVar11._4_4_ = fVar45 * auVar51._4_4_;
            auVar11._0_4_ = fVar45 * auVar51._0_4_;
            auVar11._8_4_ = fVar45 * auVar51._8_4_;
            auVar11._12_4_ = fVar45 * auVar51._12_4_;
            auVar11._16_4_ = fVar45 * auVar51._16_4_;
            auVar11._20_4_ = fVar45 * auVar51._20_4_;
            auVar11._24_4_ = fVar45 * auVar51._24_4_;
            auVar11._28_4_ = auVar51._28_4_;
            auVar51 = vroundps_avx(auVar11,1);
            fVar45 = fVar45 + -1.0;
            auVar75._4_4_ = fVar45;
            auVar75._0_4_ = fVar45;
            auVar75._8_4_ = fVar45;
            auVar75._12_4_ = fVar45;
            auVar75._16_4_ = fVar45;
            auVar75._20_4_ = fVar45;
            auVar75._24_4_ = fVar45;
            auVar75._28_4_ = fVar45;
            auVar51 = vminps_avx(auVar51,auVar75);
            auVar51 = vmaxps_avx(auVar51,_DAT_01faff00);
            local_aa0 = vsubps_avx(auVar11,auVar51);
            local_ac0 = vcvtps2dq_avx(auVar51);
            local_e4c = uVar3 & 0x7fff;
            local_e50 = uVar4 & 0x7fff;
            uVar32 = *(uint *)(local_d58 + 4 + local_d60);
            uVar36 = (ulong)uVar32;
            uVar28 = (ulong)(uVar32 * local_e50 + *(int *)(local_d58 + local_d60) + local_e4c);
            lVar33 = *(long *)&pGVar38[2].numPrimitives;
            lVar30 = (long)*(int *)(local_ac0 + k * 4) * 0x38;
            lVar5 = *(long *)(lVar33 + 0x10 + lVar30);
            lVar6 = *(long *)(lVar33 + lVar30);
            auVar47 = *(undefined1 (*) [16])(lVar6 + lVar5 * uVar28);
            lVar7 = *(long *)(lVar33 + 0x48 + lVar30);
            auVar58 = *(undefined1 (*) [16])(lVar6 + (uVar28 + 1) * lVar5);
            lVar37 = uVar36 + uVar28;
            auVar72 = *(undefined1 (*) [16])(lVar6 + lVar37 * lVar5);
            lVar34 = uVar28 + uVar36 + 1;
            auVar73 = *(undefined1 (*) [16])(lVar6 + lVar34 * lVar5);
            lVar29 = uVar28 + (-1 < (short)uVar3) + 1;
            auVar46 = *(undefined1 (*) [16])(lVar6 + lVar29 * lVar5);
            lVar31 = (ulong)(-1 < (short)uVar3) + lVar34;
            auVar80 = *(undefined1 (*) [16])(lVar6 + lVar31 * lVar5);
            uVar39 = 0;
            if (-1 < (short)uVar4) {
              uVar39 = uVar36;
            }
            auVar81 = *(undefined1 (*) [16])(lVar6 + (lVar37 + uVar39) * lVar5);
            auVar87 = *(undefined1 (*) [16])(lVar6 + (lVar34 + uVar39) * lVar5);
            auVar49 = *(undefined1 (*) [16])(lVar6 + lVar5 * (uVar39 + lVar31));
            lVar33 = *(long *)(lVar33 + 0x38 + lVar30);
            uVar1 = *(undefined4 *)(local_aa0 + local_e60 * 4);
            auVar174._4_4_ = uVar1;
            auVar174._0_4_ = uVar1;
            auVar174._8_4_ = uVar1;
            auVar174._12_4_ = uVar1;
            auVar60 = vsubps_avx(*(undefined1 (*) [16])(lVar33 + lVar7 * uVar28),auVar47);
            auVar60 = vfmadd213ps_fma(auVar60,auVar174,auVar47);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(lVar33 + lVar7 * (uVar28 + 1)),auVar58);
            auVar74 = vfmadd213ps_fma(auVar47,auVar174,auVar58);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(lVar33 + lVar7 * lVar37),auVar72);
            auVar82 = vfmadd213ps_fma(auVar47,auVar174,auVar72);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(lVar33 + lVar7 * lVar34),auVar73);
            auVar88 = vfmadd213ps_fma(auVar47,auVar174,auVar73);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(lVar33 + lVar7 * lVar29),auVar46);
            auVar58 = vfmadd213ps_fma(auVar47,auVar174,auVar46);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(lVar33 + lVar7 * lVar31),auVar80);
            auVar48 = vfmadd213ps_fma(auVar47,auVar174,auVar80);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(lVar33 + lVar7 * (lVar37 + uVar39)),auVar81)
            ;
            auVar59 = vfmadd213ps_fma(auVar47,auVar174,auVar81);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(lVar33 + lVar7 * (lVar34 + uVar39)),auVar87)
            ;
            auVar89 = vfmadd213ps_fma(auVar47,auVar174,auVar87);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(lVar33 + (uVar39 + lVar31) * lVar7),auVar49)
            ;
            auVar49 = vfmadd213ps_fma(auVar47,auVar174,auVar49);
            auVar72 = vunpcklps_avx(auVar74,auVar48);
            auVar47 = vunpckhps_avx(auVar74,auVar48);
            auVar46 = vunpcklps_avx(auVar58,auVar88);
            auVar58 = vunpckhps_avx(auVar58,auVar88);
            auVar73 = vunpcklps_avx(auVar47,auVar58);
            auVar80 = vunpcklps_avx(auVar72,auVar46);
            auVar47 = vunpckhps_avx(auVar72,auVar46);
            auVar46 = vunpcklps_avx(auVar82,auVar89);
            auVar58 = vunpckhps_avx(auVar82,auVar89);
            auVar81 = vunpcklps_avx(auVar88,auVar59);
            auVar72 = vunpckhps_avx(auVar88,auVar59);
            auVar72 = vunpcklps_avx(auVar58,auVar72);
            auVar87 = vunpcklps_avx(auVar46,auVar81);
            auVar58 = vunpckhps_avx(auVar46,auVar81);
            auVar99._16_16_ = auVar89;
            auVar99._0_16_ = auVar82;
            auVar54._16_16_ = auVar48;
            auVar54._0_16_ = auVar74;
            auVar51 = vunpcklps_avx(auVar54,auVar99);
            auVar112._16_16_ = auVar88;
            auVar112._0_16_ = auVar60;
            auVar63._16_16_ = auVar49;
            auVar63._0_16_ = auVar88;
            auVar52 = vunpcklps_avx(auVar112,auVar63);
            auVar11 = vunpcklps_avx(auVar52,auVar51);
            auVar51 = vunpckhps_avx(auVar52,auVar51);
            auVar52 = vunpckhps_avx(auVar54,auVar99);
            auVar61 = vunpckhps_avx(auVar112,auVar63);
            auVar52 = vunpcklps_avx(auVar61,auVar52);
            auVar64._16_16_ = auVar80;
            auVar64._0_16_ = auVar80;
            auVar90._16_16_ = auVar47;
            auVar90._0_16_ = auVar47;
            auVar105._16_16_ = auVar73;
            auVar105._0_16_ = auVar73;
            auVar113._16_16_ = auVar87;
            auVar113._0_16_ = auVar87;
            auVar175._16_16_ = auVar58;
            auVar175._0_16_ = auVar58;
            uVar1 = *(undefined4 *)(local_e58 + local_e60 * 4);
            auVar132._4_4_ = uVar1;
            auVar132._0_4_ = uVar1;
            auVar132._8_4_ = uVar1;
            auVar132._12_4_ = uVar1;
            auVar132._16_4_ = uVar1;
            auVar132._20_4_ = uVar1;
            auVar132._24_4_ = uVar1;
            auVar132._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_e58 + local_e60 * 4 + 0x20);
            auVar143._4_4_ = uVar1;
            auVar143._0_4_ = uVar1;
            auVar143._8_4_ = uVar1;
            auVar143._12_4_ = uVar1;
            auVar143._16_4_ = uVar1;
            auVar143._20_4_ = uVar1;
            auVar143._24_4_ = uVar1;
            auVar143._28_4_ = uVar1;
            auVar83._16_16_ = auVar72;
            auVar83._0_16_ = auVar72;
            uVar1 = *(undefined4 *)(local_e58 + local_e60 * 4 + 0x40);
            auVar164._4_4_ = uVar1;
            auVar164._0_4_ = uVar1;
            auVar164._8_4_ = uVar1;
            auVar164._12_4_ = uVar1;
            auVar164._16_4_ = uVar1;
            auVar164._20_4_ = uVar1;
            auVar164._24_4_ = uVar1;
            auVar164._28_4_ = uVar1;
            auVar11 = vsubps_avx(auVar11,auVar132);
            auVar53 = vsubps_avx(auVar51,auVar143);
            auVar62 = vsubps_avx(auVar52,auVar164);
            auVar51 = vsubps_avx(auVar64,auVar132);
            auVar52 = vsubps_avx(auVar90,auVar143);
            auVar61 = vsubps_avx(auVar105,auVar164);
            auVar75 = vsubps_avx(auVar113,auVar132);
            auVar54 = vsubps_avx(auVar175,auVar143);
            auVar151 = vsubps_avx(auVar83,auVar164);
            local_ba0 = vsubps_avx(auVar75,auVar11);
            auVar63 = vsubps_avx(auVar54,auVar53);
            local_bc0 = vsubps_avx(auVar151,auVar62);
            auVar55._0_4_ = auVar11._0_4_ + auVar75._0_4_;
            auVar55._4_4_ = auVar11._4_4_ + auVar75._4_4_;
            auVar55._8_4_ = auVar11._8_4_ + auVar75._8_4_;
            auVar55._12_4_ = auVar11._12_4_ + auVar75._12_4_;
            auVar55._16_4_ = auVar11._16_4_ + auVar75._16_4_;
            auVar55._20_4_ = auVar11._20_4_ + auVar75._20_4_;
            auVar55._24_4_ = auVar11._24_4_ + auVar75._24_4_;
            fVar129 = auVar11._28_4_;
            auVar55._28_4_ = fVar129 + auVar75._28_4_;
            auVar76._0_4_ = auVar53._0_4_ + auVar54._0_4_;
            auVar76._4_4_ = auVar53._4_4_ + auVar54._4_4_;
            auVar76._8_4_ = auVar53._8_4_ + auVar54._8_4_;
            auVar76._12_4_ = auVar53._12_4_ + auVar54._12_4_;
            auVar76._16_4_ = auVar53._16_4_ + auVar54._16_4_;
            auVar76._20_4_ = auVar53._20_4_ + auVar54._20_4_;
            auVar76._24_4_ = auVar53._24_4_ + auVar54._24_4_;
            auVar76._28_4_ = auVar53._28_4_ + auVar54._28_4_;
            fVar117 = auVar62._0_4_;
            auVar106._0_4_ = fVar117 + auVar151._0_4_;
            fVar123 = auVar62._4_4_;
            auVar106._4_4_ = fVar123 + auVar151._4_4_;
            fVar124 = auVar62._8_4_;
            auVar106._8_4_ = fVar124 + auVar151._8_4_;
            fVar125 = auVar62._12_4_;
            auVar106._12_4_ = fVar125 + auVar151._12_4_;
            fVar126 = auVar62._16_4_;
            auVar106._16_4_ = fVar126 + auVar151._16_4_;
            fVar127 = auVar62._20_4_;
            auVar106._20_4_ = fVar127 + auVar151._20_4_;
            fVar128 = auVar62._24_4_;
            auVar106._24_4_ = fVar128 + auVar151._24_4_;
            fVar66 = auVar62._28_4_;
            auVar106._28_4_ = fVar66 + auVar151._28_4_;
            auVar9._4_4_ = local_bc0._4_4_ * auVar76._4_4_;
            auVar9._0_4_ = local_bc0._0_4_ * auVar76._0_4_;
            auVar9._8_4_ = local_bc0._8_4_ * auVar76._8_4_;
            auVar9._12_4_ = local_bc0._12_4_ * auVar76._12_4_;
            auVar9._16_4_ = local_bc0._16_4_ * auVar76._16_4_;
            auVar9._20_4_ = local_bc0._20_4_ * auVar76._20_4_;
            auVar9._24_4_ = local_bc0._24_4_ * auVar76._24_4_;
            auVar9._28_4_ = uVar1;
            auVar58 = vfmsub231ps_fma(auVar9,auVar63,auVar106);
            auVar10._4_4_ = local_ba0._4_4_ * auVar106._4_4_;
            auVar10._0_4_ = local_ba0._0_4_ * auVar106._0_4_;
            auVar10._8_4_ = local_ba0._8_4_ * auVar106._8_4_;
            auVar10._12_4_ = local_ba0._12_4_ * auVar106._12_4_;
            auVar10._16_4_ = local_ba0._16_4_ * auVar106._16_4_;
            auVar10._20_4_ = local_ba0._20_4_ * auVar106._20_4_;
            auVar10._24_4_ = local_ba0._24_4_ * auVar106._24_4_;
            auVar10._28_4_ = auVar106._28_4_;
            auVar47 = vfmsub231ps_fma(auVar10,local_bc0,auVar55);
            auVar12._4_4_ = auVar63._4_4_ * auVar55._4_4_;
            auVar12._0_4_ = auVar63._0_4_ * auVar55._0_4_;
            auVar12._8_4_ = auVar63._8_4_ * auVar55._8_4_;
            auVar12._12_4_ = auVar63._12_4_ * auVar55._12_4_;
            auVar12._16_4_ = auVar63._16_4_ * auVar55._16_4_;
            auVar12._20_4_ = auVar63._20_4_ * auVar55._20_4_;
            auVar12._24_4_ = auVar63._24_4_ * auVar55._24_4_;
            auVar12._28_4_ = auVar55._28_4_;
            auVar72 = vfmsub231ps_fma(auVar12,local_ba0,auVar76);
            uVar1 = *(undefined4 *)(local_e58 + local_e60 * 4 + 0xa0);
            local_e20._4_4_ = uVar1;
            local_e20._0_4_ = uVar1;
            local_e20._8_4_ = uVar1;
            local_e20._12_4_ = uVar1;
            local_e20._16_4_ = uVar1;
            local_e20._20_4_ = uVar1;
            local_e20._24_4_ = uVar1;
            local_e20._28_4_ = uVar1;
            fVar45 = *(float *)(local_e58 + local_e60 * 4 + 0xc0);
            auVar13._4_4_ = fVar45 * auVar72._4_4_;
            auVar13._0_4_ = fVar45 * auVar72._0_4_;
            auVar13._8_4_ = fVar45 * auVar72._8_4_;
            auVar13._12_4_ = fVar45 * auVar72._12_4_;
            auVar13._16_4_ = fVar45 * 0.0;
            auVar13._20_4_ = fVar45 * 0.0;
            auVar13._24_4_ = fVar45 * 0.0;
            auVar13._28_4_ = auVar63._28_4_;
            auVar47 = vfmadd231ps_fma(auVar13,local_e20,ZEXT1632(auVar47));
            uVar1 = *(undefined4 *)(local_e58 + local_e60 * 4 + 0x80);
            local_e40._4_4_ = uVar1;
            local_e40._0_4_ = uVar1;
            local_e40._8_4_ = uVar1;
            local_e40._12_4_ = uVar1;
            local_e40._16_4_ = uVar1;
            local_e40._20_4_ = uVar1;
            local_e40._24_4_ = uVar1;
            local_e40._28_4_ = uVar1;
            auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),local_e40,ZEXT1632(auVar58));
            local_be0 = vsubps_avx(auVar53,auVar52);
            local_c00 = vsubps_avx(auVar62,auVar61);
            auVar172._0_4_ = auVar53._0_4_ + auVar52._0_4_;
            auVar172._4_4_ = auVar53._4_4_ + auVar52._4_4_;
            auVar172._8_4_ = auVar53._8_4_ + auVar52._8_4_;
            auVar172._12_4_ = auVar53._12_4_ + auVar52._12_4_;
            auVar172._16_4_ = auVar53._16_4_ + auVar52._16_4_;
            auVar172._20_4_ = auVar53._20_4_ + auVar52._20_4_;
            auVar172._24_4_ = auVar53._24_4_ + auVar52._24_4_;
            auVar172._28_4_ = auVar53._28_4_ + auVar52._28_4_;
            auVar107._0_4_ = fVar117 + auVar61._0_4_;
            auVar107._4_4_ = fVar123 + auVar61._4_4_;
            auVar107._8_4_ = fVar124 + auVar61._8_4_;
            auVar107._12_4_ = fVar125 + auVar61._12_4_;
            auVar107._16_4_ = fVar126 + auVar61._16_4_;
            auVar107._20_4_ = fVar127 + auVar61._20_4_;
            auVar107._24_4_ = fVar128 + auVar61._24_4_;
            auVar107._28_4_ = fVar66 + auVar61._28_4_;
            fVar57 = local_c00._0_4_;
            fVar67 = local_c00._4_4_;
            auVar14._4_4_ = auVar172._4_4_ * fVar67;
            auVar14._0_4_ = auVar172._0_4_ * fVar57;
            fVar69 = local_c00._8_4_;
            auVar14._8_4_ = auVar172._8_4_ * fVar69;
            fVar71 = local_c00._12_4_;
            auVar14._12_4_ = auVar172._12_4_ * fVar71;
            fVar144 = local_c00._16_4_;
            auVar14._16_4_ = auVar172._16_4_ * fVar144;
            fVar146 = local_c00._20_4_;
            auVar14._20_4_ = auVar172._20_4_ * fVar146;
            fVar153 = local_c00._24_4_;
            auVar14._24_4_ = auVar172._24_4_ * fVar153;
            auVar14._28_4_ = fVar66;
            auVar72 = vfmsub231ps_fma(auVar14,local_be0,auVar107);
            auVar9 = vsubps_avx(auVar11,auVar51);
            fVar66 = auVar9._0_4_;
            fVar68 = auVar9._4_4_;
            auVar15._4_4_ = auVar107._4_4_ * fVar68;
            auVar15._0_4_ = auVar107._0_4_ * fVar66;
            fVar70 = auVar9._8_4_;
            auVar15._8_4_ = auVar107._8_4_ * fVar70;
            fVar116 = auVar9._12_4_;
            auVar15._12_4_ = auVar107._12_4_ * fVar116;
            fVar145 = auVar9._16_4_;
            auVar15._16_4_ = auVar107._16_4_ * fVar145;
            fVar152 = auVar9._20_4_;
            auVar15._20_4_ = auVar107._20_4_ * fVar152;
            fVar154 = auVar9._24_4_;
            auVar15._24_4_ = auVar107._24_4_ * fVar154;
            auVar15._28_4_ = local_ba0._28_4_;
            auVar108._0_4_ = auVar11._0_4_ + auVar51._0_4_;
            auVar108._4_4_ = auVar11._4_4_ + auVar51._4_4_;
            auVar108._8_4_ = auVar11._8_4_ + auVar51._8_4_;
            auVar108._12_4_ = auVar11._12_4_ + auVar51._12_4_;
            auVar108._16_4_ = auVar11._16_4_ + auVar51._16_4_;
            auVar108._20_4_ = auVar11._20_4_ + auVar51._20_4_;
            auVar108._24_4_ = auVar11._24_4_ + auVar51._24_4_;
            auVar108._28_4_ = fVar129 + auVar51._28_4_;
            auVar58 = vfmsub231ps_fma(auVar15,local_c00,auVar108);
            fVar162 = local_be0._0_4_;
            fVar165 = local_be0._4_4_;
            auVar16._4_4_ = fVar165 * auVar108._4_4_;
            auVar16._0_4_ = fVar162 * auVar108._0_4_;
            fVar166 = local_be0._8_4_;
            auVar16._8_4_ = fVar166 * auVar108._8_4_;
            fVar167 = local_be0._12_4_;
            auVar16._12_4_ = fVar167 * auVar108._12_4_;
            fVar168 = local_be0._16_4_;
            auVar16._16_4_ = fVar168 * auVar108._16_4_;
            fVar169 = local_be0._20_4_;
            auVar16._20_4_ = fVar169 * auVar108._20_4_;
            fVar170 = local_be0._24_4_;
            auVar16._24_4_ = fVar170 * auVar108._24_4_;
            auVar16._28_4_ = auVar108._28_4_;
            auVar46 = vfmsub231ps_fma(auVar16,auVar9,auVar172);
            auVar17._4_4_ = fVar45 * auVar46._4_4_;
            auVar17._0_4_ = fVar45 * auVar46._0_4_;
            auVar17._8_4_ = fVar45 * auVar46._8_4_;
            auVar17._12_4_ = fVar45 * auVar46._12_4_;
            auVar17._16_4_ = fVar45 * 0.0;
            auVar17._20_4_ = fVar45 * 0.0;
            auVar17._24_4_ = fVar45 * 0.0;
            auVar17._28_4_ = fVar129;
            auVar58 = vfmadd231ps_fma(auVar17,local_e20,ZEXT1632(auVar58));
            auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),local_e40,ZEXT1632(auVar72));
            auVar10 = vsubps_avx(auVar51,auVar75);
            auVar91._0_4_ = auVar51._0_4_ + auVar75._0_4_;
            auVar91._4_4_ = auVar51._4_4_ + auVar75._4_4_;
            auVar91._8_4_ = auVar51._8_4_ + auVar75._8_4_;
            auVar91._12_4_ = auVar51._12_4_ + auVar75._12_4_;
            auVar91._16_4_ = auVar51._16_4_ + auVar75._16_4_;
            auVar91._20_4_ = auVar51._20_4_ + auVar75._20_4_;
            auVar91._24_4_ = auVar51._24_4_ + auVar75._24_4_;
            auVar91._28_4_ = auVar51._28_4_ + auVar75._28_4_;
            auVar75 = vsubps_avx(auVar52,auVar54);
            auVar114._0_4_ = auVar52._0_4_ + auVar54._0_4_;
            auVar114._4_4_ = auVar52._4_4_ + auVar54._4_4_;
            auVar114._8_4_ = auVar52._8_4_ + auVar54._8_4_;
            auVar114._12_4_ = auVar52._12_4_ + auVar54._12_4_;
            auVar114._16_4_ = auVar52._16_4_ + auVar54._16_4_;
            auVar114._20_4_ = auVar52._20_4_ + auVar54._20_4_;
            auVar114._24_4_ = auVar52._24_4_ + auVar54._24_4_;
            auVar114._28_4_ = auVar52._28_4_ + auVar54._28_4_;
            auVar54 = vsubps_avx(auVar61,auVar151);
            auVar84._0_4_ = auVar61._0_4_ + auVar151._0_4_;
            auVar84._4_4_ = auVar61._4_4_ + auVar151._4_4_;
            auVar84._8_4_ = auVar61._8_4_ + auVar151._8_4_;
            auVar84._12_4_ = auVar61._12_4_ + auVar151._12_4_;
            auVar84._16_4_ = auVar61._16_4_ + auVar151._16_4_;
            auVar84._20_4_ = auVar61._20_4_ + auVar151._20_4_;
            auVar84._24_4_ = auVar61._24_4_ + auVar151._24_4_;
            auVar84._28_4_ = auVar61._28_4_ + auVar151._28_4_;
            auVar120._0_4_ = auVar114._0_4_ * auVar54._0_4_;
            auVar120._4_4_ = auVar114._4_4_ * auVar54._4_4_;
            auVar120._8_4_ = auVar114._8_4_ * auVar54._8_4_;
            auVar120._12_4_ = auVar114._12_4_ * auVar54._12_4_;
            auVar120._16_4_ = auVar114._16_4_ * auVar54._16_4_;
            auVar120._20_4_ = auVar114._20_4_ * auVar54._20_4_;
            auVar120._24_4_ = auVar114._24_4_ * auVar54._24_4_;
            auVar120._28_4_ = 0;
            auVar46 = vfmsub231ps_fma(auVar120,auVar75,auVar84);
            auVar151._4_4_ = auVar84._4_4_ * auVar10._4_4_;
            auVar151._0_4_ = auVar84._0_4_ * auVar10._0_4_;
            auVar151._8_4_ = auVar84._8_4_ * auVar10._8_4_;
            auVar151._12_4_ = auVar84._12_4_ * auVar10._12_4_;
            auVar151._16_4_ = auVar84._16_4_ * auVar10._16_4_;
            auVar151._20_4_ = auVar84._20_4_ * auVar10._20_4_;
            auVar151._24_4_ = auVar84._24_4_ * auVar10._24_4_;
            auVar151._28_4_ = auVar84._28_4_;
            auVar72 = vfmsub231ps_fma(auVar151,auVar54,auVar91);
            auVar18._4_4_ = auVar91._4_4_ * auVar75._4_4_;
            auVar18._0_4_ = auVar91._0_4_ * auVar75._0_4_;
            auVar18._8_4_ = auVar91._8_4_ * auVar75._8_4_;
            auVar18._12_4_ = auVar91._12_4_ * auVar75._12_4_;
            auVar18._16_4_ = auVar91._16_4_ * auVar75._16_4_;
            auVar18._20_4_ = auVar91._20_4_ * auVar75._20_4_;
            auVar18._24_4_ = auVar91._24_4_ * auVar75._24_4_;
            auVar18._28_4_ = auVar91._28_4_;
            auVar73 = vfmsub231ps_fma(auVar18,auVar10,auVar114);
            auVar92._0_4_ = fVar45 * auVar73._0_4_;
            auVar92._4_4_ = fVar45 * auVar73._4_4_;
            auVar92._8_4_ = fVar45 * auVar73._8_4_;
            auVar92._12_4_ = fVar45 * auVar73._12_4_;
            auVar92._16_4_ = fVar45 * 0.0;
            auVar92._20_4_ = fVar45 * 0.0;
            auVar92._24_4_ = fVar45 * 0.0;
            auVar92._28_4_ = 0;
            auVar72 = vfmadd231ps_fma(auVar92,local_e20,ZEXT1632(auVar72));
            auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),local_e40,ZEXT1632(auVar46));
            fVar155 = auVar72._0_4_ + auVar47._0_4_ + auVar58._0_4_;
            fVar159 = auVar72._4_4_ + auVar47._4_4_ + auVar58._4_4_;
            fVar160 = auVar72._8_4_ + auVar47._8_4_ + auVar58._8_4_;
            fVar161 = auVar72._12_4_ + auVar47._12_4_ + auVar58._12_4_;
            local_d20 = ZEXT1632(CONCAT412(fVar161,CONCAT48(fVar160,CONCAT44(fVar159,fVar155))));
            auVar85._8_4_ = 0x7fffffff;
            auVar85._0_8_ = 0x7fffffff7fffffff;
            auVar85._12_4_ = 0x7fffffff;
            auVar85._16_4_ = 0x7fffffff;
            auVar85._20_4_ = 0x7fffffff;
            auVar85._24_4_ = 0x7fffffff;
            auVar85._28_4_ = 0x7fffffff;
            local_ae0 = ZEXT1632(auVar47);
            auVar51 = vminps_avx(local_ae0,ZEXT1632(auVar58));
            auVar51 = vminps_avx(auVar51,ZEXT1632(auVar72));
            local_b40 = vandps_avx(local_d20,auVar85);
            fVar129 = local_b40._0_4_ * 1.1920929e-07;
            fVar135 = local_b40._4_4_ * 1.1920929e-07;
            auVar19._4_4_ = fVar135;
            auVar19._0_4_ = fVar129;
            fVar136 = local_b40._8_4_ * 1.1920929e-07;
            auVar19._8_4_ = fVar136;
            fVar137 = local_b40._12_4_ * 1.1920929e-07;
            auVar19._12_4_ = fVar137;
            fVar138 = local_b40._16_4_ * 1.1920929e-07;
            auVar19._16_4_ = fVar138;
            fVar139 = local_b40._20_4_ * 1.1920929e-07;
            auVar19._20_4_ = fVar139;
            fVar140 = local_b40._24_4_ * 1.1920929e-07;
            auVar19._24_4_ = fVar140;
            auVar19._28_4_ = 0x34000000;
            auVar121._0_8_ = CONCAT44(fVar135,fVar129) ^ 0x8000000080000000;
            auVar121._8_4_ = -fVar136;
            auVar121._12_4_ = -fVar137;
            auVar121._16_4_ = -fVar138;
            auVar121._20_4_ = -fVar139;
            auVar121._24_4_ = -fVar140;
            auVar121._28_4_ = 0xb4000000;
            auVar51 = vcmpps_avx(auVar51,auVar121,5);
            auVar151 = ZEXT1632(auVar58);
            auVar61 = vmaxps_avx(local_ae0,auVar151);
            auVar52 = vmaxps_avx(auVar61,ZEXT1632(auVar72));
            auVar52 = vcmpps_avx(auVar52,auVar19,2);
            auVar52 = vorps_avx(auVar51,auVar52);
            k = local_e60;
            ray = local_e58;
            if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar52 >> 0x7f,0) != '\0') ||
                  (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar52 >> 0xbf,0) != '\0') ||
                (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar52[0x1f] < '\0') {
              auVar20._4_4_ = local_bc0._4_4_ * fVar165;
              auVar20._0_4_ = local_bc0._0_4_ * fVar162;
              auVar20._8_4_ = local_bc0._8_4_ * fVar166;
              auVar20._12_4_ = local_bc0._12_4_ * fVar167;
              auVar20._16_4_ = local_bc0._16_4_ * fVar168;
              auVar20._20_4_ = local_bc0._20_4_ * fVar169;
              auVar20._24_4_ = local_bc0._24_4_ * fVar170;
              auVar20._28_4_ = auVar51._28_4_;
              auVar21._4_4_ = fVar68 * auVar63._4_4_;
              auVar21._0_4_ = fVar66 * auVar63._0_4_;
              auVar21._8_4_ = fVar70 * auVar63._8_4_;
              auVar21._12_4_ = fVar116 * auVar63._12_4_;
              auVar21._16_4_ = fVar145 * auVar63._16_4_;
              auVar21._20_4_ = fVar152 * auVar63._20_4_;
              auVar21._24_4_ = fVar154 * auVar63._24_4_;
              auVar21._28_4_ = auVar61._28_4_;
              auVar47 = vfmsub213ps_fma(auVar63,local_c00,auVar20);
              auVar22._4_4_ = auVar75._4_4_ * fVar67;
              auVar22._0_4_ = auVar75._0_4_ * fVar57;
              auVar22._8_4_ = auVar75._8_4_ * fVar69;
              auVar22._12_4_ = auVar75._12_4_ * fVar71;
              auVar22._16_4_ = auVar75._16_4_ * fVar144;
              auVar22._20_4_ = auVar75._20_4_ * fVar146;
              auVar22._24_4_ = auVar75._24_4_ * fVar153;
              auVar22._28_4_ = 0x34000000;
              auVar23._4_4_ = fVar68 * auVar54._4_4_;
              auVar23._0_4_ = fVar66 * auVar54._0_4_;
              auVar23._8_4_ = fVar70 * auVar54._8_4_;
              auVar23._12_4_ = fVar116 * auVar54._12_4_;
              auVar23._16_4_ = fVar145 * auVar54._16_4_;
              auVar23._20_4_ = fVar152 * auVar54._20_4_;
              auVar23._24_4_ = fVar154 * auVar54._24_4_;
              auVar23._28_4_ = 0;
              auVar58 = vfmsub213ps_fma(auVar54,local_be0,auVar22);
              auVar51 = vandps_avx(auVar20,auVar85);
              auVar61 = vandps_avx(auVar22,auVar85);
              auVar51 = vcmpps_avx(auVar51,auVar61,1);
              auVar54 = vblendvps_avx(ZEXT1632(auVar58),ZEXT1632(auVar47),auVar51);
              auVar100._0_4_ = auVar10._0_4_ * fVar162;
              auVar100._4_4_ = auVar10._4_4_ * fVar165;
              auVar100._8_4_ = auVar10._8_4_ * fVar166;
              auVar100._12_4_ = auVar10._12_4_ * fVar167;
              auVar100._16_4_ = auVar10._16_4_ * fVar168;
              auVar100._20_4_ = auVar10._20_4_ * fVar169;
              auVar100._24_4_ = auVar10._24_4_ * fVar170;
              auVar100._28_4_ = 0;
              auVar47 = vfmsub213ps_fma(auVar10,local_c00,auVar23);
              auVar24._4_4_ = local_ba0._4_4_ * fVar67;
              auVar24._0_4_ = local_ba0._0_4_ * fVar57;
              auVar24._8_4_ = local_ba0._8_4_ * fVar69;
              auVar24._12_4_ = local_ba0._12_4_ * fVar71;
              auVar24._16_4_ = local_ba0._16_4_ * fVar144;
              auVar24._20_4_ = local_ba0._20_4_ * fVar146;
              auVar24._24_4_ = local_ba0._24_4_ * fVar153;
              auVar24._28_4_ = auVar51._28_4_;
              auVar58 = vfmsub213ps_fma(local_bc0,auVar9,auVar24);
              auVar51 = vandps_avx(auVar24,auVar85);
              auVar61 = vandps_avx(auVar23,auVar85);
              auVar51 = vcmpps_avx(auVar51,auVar61,1);
              auVar63 = vblendvps_avx(ZEXT1632(auVar47),ZEXT1632(auVar58),auVar51);
              auVar47 = vfmsub213ps_fma(local_ba0,local_be0,auVar21);
              auVar58 = vfmsub213ps_fma(auVar75,auVar9,auVar100);
              auVar51 = vandps_avx(auVar21,auVar85);
              auVar61 = vandps_avx(auVar100,auVar85);
              auVar51 = vcmpps_avx(auVar51,auVar61,1);
              auVar51 = vblendvps_avx(ZEXT1632(auVar58),ZEXT1632(auVar47),auVar51);
              auVar47 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
              fVar57 = auVar51._0_4_;
              auVar86._0_4_ = fVar57 * fVar45;
              fVar66 = auVar51._4_4_;
              auVar86._4_4_ = fVar66 * fVar45;
              fVar67 = auVar51._8_4_;
              auVar86._8_4_ = fVar67 * fVar45;
              fVar68 = auVar51._12_4_;
              auVar86._12_4_ = fVar68 * fVar45;
              fVar69 = auVar51._16_4_;
              auVar86._16_4_ = fVar69 * fVar45;
              fVar70 = auVar51._20_4_;
              auVar86._20_4_ = fVar70 * fVar45;
              fVar71 = auVar51._24_4_;
              auVar86._24_4_ = fVar71 * fVar45;
              auVar86._28_4_ = 0;
              auVar58 = vfmadd213ps_fma(local_e20,auVar63,auVar86);
              auVar58 = vfmadd213ps_fma(local_e40,auVar54,ZEXT1632(auVar58));
              auVar61 = ZEXT1632(CONCAT412(auVar58._12_4_ + auVar58._12_4_,
                                           CONCAT48(auVar58._8_4_ + auVar58._8_4_,
                                                    CONCAT44(auVar58._4_4_ + auVar58._4_4_,
                                                             auVar58._0_4_ + auVar58._0_4_))));
              auVar93._0_4_ = fVar57 * fVar117;
              auVar93._4_4_ = fVar66 * fVar123;
              auVar93._8_4_ = fVar67 * fVar124;
              auVar93._12_4_ = fVar68 * fVar125;
              auVar93._16_4_ = fVar69 * fVar126;
              auVar93._20_4_ = fVar70 * fVar127;
              auVar93._24_4_ = fVar71 * fVar128;
              auVar93._28_4_ = 0;
              auVar58 = vfmadd213ps_fma(auVar53,auVar63,auVar93);
              auVar72 = vfmadd213ps_fma(auVar11,auVar54,ZEXT1632(auVar58));
              auVar51 = vrcpps_avx(auVar61);
              auVar133._8_4_ = 0x3f800000;
              auVar133._0_8_ = 0x3f8000003f800000;
              auVar133._12_4_ = 0x3f800000;
              auVar133._16_4_ = 0x3f800000;
              auVar133._20_4_ = 0x3f800000;
              auVar133._24_4_ = 0x3f800000;
              auVar133._28_4_ = 0x3f800000;
              auVar58 = vfnmadd213ps_fma(auVar51,auVar61,auVar133);
              auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar51,auVar51);
              local_9a0 = ZEXT1632(CONCAT412(auVar58._12_4_ * (auVar72._12_4_ + auVar72._12_4_),
                                             CONCAT48(auVar58._8_4_ *
                                                      (auVar72._8_4_ + auVar72._8_4_),
                                                      CONCAT44(auVar58._4_4_ *
                                                               (auVar72._4_4_ + auVar72._4_4_),
                                                               auVar58._0_4_ *
                                                               (auVar72._0_4_ + auVar72._0_4_)))));
              uVar1 = *(undefined4 *)(local_e58 + local_e60 * 4 + 0x60);
              auVar115._4_4_ = uVar1;
              auVar115._0_4_ = uVar1;
              auVar115._8_4_ = uVar1;
              auVar115._12_4_ = uVar1;
              auVar115._16_4_ = uVar1;
              auVar115._20_4_ = uVar1;
              auVar115._24_4_ = uVar1;
              auVar115._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(local_e58 + local_e60 * 4 + 0x100);
              local_d40._4_4_ = uVar1;
              local_d40._0_4_ = uVar1;
              local_d40._8_4_ = uVar1;
              local_d40._12_4_ = uVar1;
              local_d40._16_4_ = uVar1;
              local_d40._20_4_ = uVar1;
              local_d40._24_4_ = uVar1;
              local_d40._28_4_ = uVar1;
              auVar101 = ZEXT3264(local_d40);
              auVar51 = vcmpps_avx(auVar115,local_9a0,2);
              auVar52 = vcmpps_avx(local_9a0,local_d40,2);
              auVar51 = vandps_avx(auVar52,auVar51);
              auVar58 = vpackssdw_avx(auVar51._0_16_,auVar51._16_16_);
              auVar47 = vpand_avx(auVar58,auVar47);
              auVar51 = vpmovsxwd_avx2(auVar47);
              if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar51 >> 0x7f,0) != '\0') ||
                    (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar51 >> 0xbf,0) != '\0') ||
                  (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar51[0x1f] < '\0') {
                auVar51 = vcmpps_avx(auVar61,_DAT_01faff00,4);
                auVar58 = vpackssdw_avx(auVar51._0_16_,auVar51._16_16_);
                auVar47 = vpand_avx(auVar47,auVar58);
                local_a00 = vpmovsxwd_avx2(auVar47);
                if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (local_a00 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_a00 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(local_a00 >> 0x7f,0) != '\0') ||
                      (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(local_a00 >> 0xbf,0) != '\0') ||
                    (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    local_a00[0x1f] < '\0') {
                  local_a40 = local_d20;
                  local_a20 = &local_e61;
                  auVar51 = vsubps_avx(local_d20,auVar151);
                  local_a80 = vblendvps_avx(local_ae0,auVar51,local_b00);
                  auVar51 = vsubps_avx(local_d20,local_ae0);
                  local_a60 = vblendvps_avx(auVar151,auVar51,local_b00);
                  local_980[0] = auVar54._0_4_ * (float)local_b20._0_4_;
                  local_980[1] = auVar54._4_4_ * (float)local_b20._4_4_;
                  local_980[2] = auVar54._8_4_ * fStack_b18;
                  local_980[3] = auVar54._12_4_ * fStack_b14;
                  fStack_970 = auVar54._16_4_ * fStack_b10;
                  fStack_96c = auVar54._20_4_ * fStack_b0c;
                  fStack_968 = auVar54._24_4_ * fStack_b08;
                  uStack_964 = local_b00._28_4_;
                  local_960[0] = (float)local_b20._0_4_ * auVar63._0_4_;
                  local_960[1] = (float)local_b20._4_4_ * auVar63._4_4_;
                  local_960[2] = fStack_b18 * auVar63._8_4_;
                  local_960[3] = fStack_b14 * auVar63._12_4_;
                  fStack_950 = fStack_b10 * auVar63._16_4_;
                  fStack_94c = fStack_b0c * auVar63._20_4_;
                  fStack_948 = fStack_b08 * auVar63._24_4_;
                  uStack_944 = auVar63._28_4_;
                  local_940._4_4_ = (float)local_b20._4_4_ * fVar66;
                  local_940._0_4_ = (float)local_b20._0_4_ * fVar57;
                  local_940._8_4_ = fStack_b18 * fVar67;
                  local_940._12_4_ = fStack_b14 * fVar68;
                  local_940._16_4_ = fStack_b10 * fVar69;
                  local_940._20_4_ = fStack_b0c * fVar70;
                  local_940._24_4_ = fStack_b08 * fVar71;
                  local_940._28_4_ = auVar63._28_4_;
                  pGVar38 = (local_d50->geometries).items[local_e48].ptr;
                  if ((pGVar38->mask & *(uint *)(local_e58 + local_e60 * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar38->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0059fb14:
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                      return bVar44;
                    }
                    auVar56._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
                    auVar56._8_4_ = local_e4c;
                    auVar56._12_4_ = local_e4c;
                    auVar56._16_4_ = local_e4c;
                    auVar56._20_4_ = local_e4c;
                    auVar56._24_4_ = local_e4c;
                    auVar56._28_4_ = local_e4c;
                    auVar51 = vpaddd_avx2(auVar56,_DAT_01fec4a0);
                    auVar65._0_8_ = (ulong)CONCAT24(uVar4,(uint)uVar4) & 0x7fff00007fff;
                    auVar65._8_4_ = local_e50;
                    auVar65._12_4_ = local_e50;
                    auVar65._16_4_ = local_e50;
                    auVar65._20_4_ = local_e50;
                    auVar65._24_4_ = local_e50;
                    auVar65._28_4_ = local_e50;
                    auVar98._0_4_ = (float)(int)(*(ushort *)(local_d58 + 8 + local_d60) - 1);
                    auVar98._4_12_ = auVar9._4_12_;
                    auVar61 = vpaddd_avx2(auVar65,_DAT_01fec4c0);
                    auVar58 = vrcpss_avx(auVar98,auVar98);
                    auVar72 = vfnmadd213ss_fma(auVar98,auVar58,SUB6416(ZEXT464(0x40000000),0));
                    fVar45 = auVar58._0_4_ * auVar72._0_4_;
                    auVar104._0_4_ = (float)(int)(*(ushort *)(local_d58 + 10 + local_d60) - 1);
                    auVar104._4_12_ = auVar9._4_12_;
                    auVar58 = vrcpss_avx(auVar104,auVar104);
                    auVar72 = vfnmadd213ss_fma(auVar104,auVar58,SUB6416(ZEXT464(0x40000000),0));
                    fVar57 = auVar58._0_4_ * auVar72._0_4_;
                    auVar52 = vcvtdq2ps_avx(auVar51);
                    auVar61 = vcvtdq2ps_avx(auVar61);
                    auVar51 = vrcpps_avx(local_d20);
                    auVar94._8_4_ = 0x3f800000;
                    auVar94._0_8_ = 0x3f8000003f800000;
                    auVar94._12_4_ = 0x3f800000;
                    auVar94._16_4_ = 0x3f800000;
                    auVar94._20_4_ = 0x3f800000;
                    auVar94._24_4_ = 0x3f800000;
                    auVar94._28_4_ = 0x3f800000;
                    auVar58 = vfnmadd213ps_fma(local_d20,auVar51,auVar94);
                    auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar51,auVar51);
                    auVar77._8_4_ = 0x219392ef;
                    auVar77._0_8_ = 0x219392ef219392ef;
                    auVar77._12_4_ = 0x219392ef;
                    auVar77._16_4_ = 0x219392ef;
                    auVar77._20_4_ = 0x219392ef;
                    auVar77._24_4_ = 0x219392ef;
                    auVar77._28_4_ = 0x219392ef;
                    auVar51 = vcmpps_avx(local_b40,auVar77,5);
                    auVar51 = vandps_avx(ZEXT1632(auVar58),auVar51);
                    auVar25._4_4_ =
                         (fVar159 * auVar52._4_4_ + local_a80._4_4_) * fVar45 * auVar51._4_4_;
                    auVar25._0_4_ =
                         (fVar155 * auVar52._0_4_ + local_a80._0_4_) * fVar45 * auVar51._0_4_;
                    auVar25._8_4_ =
                         (fVar160 * auVar52._8_4_ + local_a80._8_4_) * fVar45 * auVar51._8_4_;
                    auVar25._12_4_ =
                         (fVar161 * auVar52._12_4_ + local_a80._12_4_) * fVar45 * auVar51._12_4_;
                    auVar25._16_4_ =
                         (auVar52._16_4_ * 0.0 + local_a80._16_4_) * fVar45 * auVar51._16_4_;
                    auVar25._20_4_ =
                         (auVar52._20_4_ * 0.0 + local_a80._20_4_) * fVar45 * auVar51._20_4_;
                    auVar25._24_4_ =
                         (auVar52._24_4_ * 0.0 + local_a80._24_4_) * fVar45 * auVar51._24_4_;
                    auVar25._28_4_ = auVar52._28_4_ + local_a80._28_4_;
                    local_9e0 = vminps_avx(auVar25,auVar94);
                    auVar26._4_4_ =
                         (fVar159 * auVar61._4_4_ + local_a60._4_4_) * fVar57 * auVar51._4_4_;
                    auVar26._0_4_ =
                         (fVar155 * auVar61._0_4_ + local_a60._0_4_) * fVar57 * auVar51._0_4_;
                    auVar26._8_4_ =
                         (fVar160 * auVar61._8_4_ + local_a60._8_4_) * fVar57 * auVar51._8_4_;
                    auVar26._12_4_ =
                         (fVar161 * auVar61._12_4_ + local_a60._12_4_) * fVar57 * auVar51._12_4_;
                    auVar26._16_4_ =
                         (auVar61._16_4_ * 0.0 + local_a60._16_4_) * fVar57 * auVar51._16_4_;
                    auVar26._20_4_ =
                         (auVar61._20_4_ * 0.0 + local_a60._20_4_) * fVar57 * auVar51._20_4_;
                    auVar26._24_4_ =
                         (auVar61._24_4_ * 0.0 + local_a60._24_4_) * fVar57 * auVar51._24_4_;
                    auVar26._28_4_ = local_9e0._28_4_;
                    local_9c0 = vminps_avx(auVar26,auVar94);
                    if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar47 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar47 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar47 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar47 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar47 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar47[0xf] < '\0') {
                      auVar47 = vpacksswb_avx(auVar47,auVar47);
                      uVar39 = 0;
                      uVar36 = (ulong)(byte)(SUB161(auVar47 >> 7,0) & 1 |
                                             (SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                                             (SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                                             (SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                                             (SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                                             (SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                                             (SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                                            SUB161(auVar47 >> 0x3f,0) << 7);
                      for (uVar28 = uVar36; (uVar28 & 1) == 0;
                          uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                        uVar39 = uVar39 + 1;
                      }
                      local_de0._0_4_ = local_de0._4_4_;
                      uStack_dd8._0_4_ = local_de0._4_4_;
                      uStack_dd8._4_4_ = local_de0._4_4_;
                      uStack_dd0._0_4_ = local_de0._4_4_;
                      uStack_dd0._4_4_ = local_de0._4_4_;
                      uStack_dc8._0_4_ = local_de0._4_4_;
                      uStack_dc8._4_4_ = local_de0._4_4_;
                      local_d00._0_4_ = local_d00._4_4_;
                      uStack_cf8._0_4_ = local_d00._4_4_;
                      uStack_cf8._4_4_ = local_d00._4_4_;
                      uStack_cf0._0_4_ = local_d00._4_4_;
                      uStack_cf0._4_4_ = local_d00._4_4_;
                      uStack_ce8._0_4_ = local_d00._4_4_;
                      uStack_ce8._4_4_ = local_d00._4_4_;
                      auStack_df8 = auVar62._8_24_;
                      local_e00 = pGVar38;
                      do {
                        local_8c0 = *(undefined4 *)(local_9e0 + uVar39 * 4);
                        local_8a0 = *(undefined4 *)(local_9c0 + uVar39 * 4);
                        *(float *)(ray + k * 4 + 0x100) = local_980[uVar39 - 8];
                        fVar45 = local_980[uVar39];
                        auVar78._4_4_ = fVar45;
                        auVar78._0_4_ = fVar45;
                        auVar78._8_4_ = fVar45;
                        auVar78._12_4_ = fVar45;
                        auVar78._16_4_ = fVar45;
                        auVar78._20_4_ = fVar45;
                        auVar78._24_4_ = fVar45;
                        auVar78._28_4_ = fVar45;
                        fVar57 = local_960[uVar39];
                        local_900._4_4_ = fVar57;
                        local_900._0_4_ = fVar57;
                        local_900._8_4_ = fVar57;
                        local_900._12_4_ = fVar57;
                        local_900._16_4_ = fVar57;
                        local_900._20_4_ = fVar57;
                        local_900._24_4_ = fVar57;
                        local_900._28_4_ = fVar57;
                        uVar1 = *(undefined4 *)(local_940 + uVar39 * 4);
                        local_8e0._4_4_ = uVar1;
                        local_8e0._0_4_ = uVar1;
                        local_8e0._8_4_ = uVar1;
                        local_8e0._12_4_ = uVar1;
                        local_8e0._16_4_ = uVar1;
                        local_8e0._20_4_ = uVar1;
                        local_8e0._24_4_ = uVar1;
                        local_8e0._28_4_ = uVar1;
                        local_c30.context = context->user;
                        local_920[0] = (RTCHitN)SUB41(fVar45,0);
                        local_920[1] = (RTCHitN)(char)((uint)fVar45 >> 8);
                        local_920[2] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
                        local_920[3] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
                        local_920[4] = (RTCHitN)SUB41(fVar45,0);
                        local_920[5] = (RTCHitN)(char)((uint)fVar45 >> 8);
                        local_920[6] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
                        local_920[7] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
                        local_920[8] = (RTCHitN)SUB41(fVar45,0);
                        local_920[9] = (RTCHitN)(char)((uint)fVar45 >> 8);
                        local_920[10] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
                        local_920[0xb] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
                        local_920[0xc] = (RTCHitN)SUB41(fVar45,0);
                        local_920[0xd] = (RTCHitN)(char)((uint)fVar45 >> 8);
                        local_920[0xe] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
                        local_920[0xf] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
                        local_920[0x10] = (RTCHitN)SUB41(fVar45,0);
                        local_920[0x11] = (RTCHitN)(char)((uint)fVar45 >> 8);
                        local_920[0x12] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
                        local_920[0x13] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
                        local_920[0x14] = (RTCHitN)SUB41(fVar45,0);
                        local_920[0x15] = (RTCHitN)(char)((uint)fVar45 >> 8);
                        local_920[0x16] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
                        local_920[0x17] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
                        local_920[0x18] = (RTCHitN)SUB41(fVar45,0);
                        local_920[0x19] = (RTCHitN)(char)((uint)fVar45 >> 8);
                        local_920[0x1a] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
                        local_920[0x1b] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
                        local_920[0x1c] = (RTCHitN)SUB41(fVar45,0);
                        local_920[0x1d] = (RTCHitN)(char)((uint)fVar45 >> 8);
                        local_920[0x1e] = (RTCHitN)(char)((uint)fVar45 >> 0x10);
                        local_920[0x1f] = (RTCHitN)(char)((uint)fVar45 >> 0x18);
                        uStack_8bc = local_8c0;
                        uStack_8b8 = local_8c0;
                        uStack_8b4 = local_8c0;
                        uStack_8b0 = local_8c0;
                        uStack_8ac = local_8c0;
                        uStack_8a8 = local_8c0;
                        uStack_8a4 = local_8c0;
                        uStack_89c = local_8a0;
                        uStack_898 = local_8a0;
                        uStack_894 = local_8a0;
                        uStack_890 = local_8a0;
                        uStack_88c = local_8a0;
                        uStack_888 = local_8a0;
                        uStack_884 = local_8a0;
                        local_880 = local_d00;
                        uStack_878 = uStack_cf8;
                        uStack_870 = uStack_cf0;
                        uStack_868 = uStack_ce8;
                        local_860 = local_de0;
                        uStack_858 = uStack_dd8;
                        uStack_850 = uStack_dd0;
                        uStack_848 = uStack_dc8;
                        auVar51 = vpcmpeqd_avx2(auVar78,auVar78);
                        uStack_83c = (local_c30.context)->instID[0];
                        local_840 = uStack_83c;
                        uStack_838 = uStack_83c;
                        uStack_834 = uStack_83c;
                        uStack_830 = uStack_83c;
                        uStack_82c = uStack_83c;
                        uStack_828 = uStack_83c;
                        uStack_824 = uStack_83c;
                        uStack_81c = (local_c30.context)->instPrimID[0];
                        local_820 = uStack_81c;
                        uStack_818 = uStack_81c;
                        uStack_814 = uStack_81c;
                        uStack_810 = uStack_81c;
                        uStack_80c = uStack_81c;
                        uStack_808 = uStack_81c;
                        uStack_804 = uStack_81c;
                        local_b80 = local_b60;
                        local_c30.valid = (int *)local_b80;
                        local_c30.geometryUserPtr = pGVar38->userPtr;
                        local_c30.hit = local_920;
                        local_c30.N = 8;
                        uVar28 = uVar39;
                        local_c30.ray = (RTCRayN *)ray;
                        if (pGVar38->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          local_e20._0_8_ = uVar36;
                          local_e40._0_8_ = uVar39;
                          auVar51 = ZEXT1632(auVar51._0_16_);
                          (*pGVar38->occlusionFilterN)(&local_c30);
                          auVar101 = ZEXT3264(local_d40);
                          auVar51 = vpcmpeqd_avx2(auVar51,auVar51);
                          k = local_e60;
                          uVar36 = local_e20._0_8_;
                          pGVar38 = local_e00;
                          ray = local_e58;
                          uVar28 = local_e40._0_8_;
                        }
                        auVar61 = vpcmpeqd_avx2(local_b80,_DAT_01faff00);
                        auVar52 = auVar51 & ~auVar61;
                        if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar52 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar52 >> 0x7f,0) == '\0') &&
                              (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar52 >> 0xbf,0) == '\0') &&
                            (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar52[0x1f]) {
                          auVar61 = auVar61 ^ auVar51;
                        }
                        else {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar38->field_8).field_0x2 & 0x40) != 0)))) {
                            local_e20._0_8_ = uVar36;
                            local_e40._0_8_ = uVar28;
                            auVar51 = ZEXT1632(auVar51._0_16_);
                            (*p_Var8)(&local_c30);
                            auVar101 = ZEXT3264(local_d40);
                            auVar51 = vpcmpeqd_avx2(auVar51,auVar51);
                            k = local_e60;
                            uVar36 = local_e20._0_8_;
                            pGVar38 = local_e00;
                            ray = local_e58;
                            uVar28 = local_e40._0_8_;
                          }
                          auVar52 = vpcmpeqd_avx2(local_b80,_DAT_01faff00);
                          auVar61 = auVar52 ^ auVar51;
                          auVar79._8_4_ = 0xff800000;
                          auVar79._0_8_ = 0xff800000ff800000;
                          auVar79._12_4_ = 0xff800000;
                          auVar79._16_4_ = 0xff800000;
                          auVar79._20_4_ = 0xff800000;
                          auVar79._24_4_ = 0xff800000;
                          auVar79._28_4_ = 0xff800000;
                          auVar51 = vblendvps_avx(auVar79,*(undefined1 (*) [32])
                                                           (local_c30.ray + 0x100),auVar52);
                          *(undefined1 (*) [32])(local_c30.ray + 0x100) = auVar51;
                        }
                        if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar61 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar61 >> 0x7f,0) != '\0') ||
                              (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar61 >> 0xbf,0) != '\0') ||
                            (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar61[0x1f] < '\0') goto LAB_0059fb14;
                        *(int *)(ray + k * 4 + 0x100) = auVar101._0_4_;
                        uVar39 = 0;
                        uVar36 = uVar36 ^ 1L << (uVar28 & 0x3f);
                        for (uVar28 = uVar36; (uVar28 & 1) == 0;
                            uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                          uVar39 = uVar39 + 1;
                        }
                      } while (uVar36 != 0);
                    }
                  }
                }
              }
            }
            local_d68 = local_d68 - 1 & local_d68;
            uVar39 = local_d90;
          } while (local_d68 != 0);
        }
        auVar176 = ZEXT1664(local_cd0);
        auVar134 = ZEXT1664(local_c50);
        auVar122 = ZEXT1664(local_c40);
        auVar109 = ZEXT1664(local_db0);
        auVar101 = ZEXT1664(local_cc0);
        local_d80 = local_d80 + 1;
        fVar66 = local_cb0;
        fVar70 = fStack_cac;
        fVar71 = fStack_ca8;
        fVar116 = fStack_ca4;
        fVar67 = local_c60;
        fVar144 = fStack_c5c;
        fVar145 = fStack_c58;
        fVar146 = fStack_c54;
        fVar68 = local_c70;
        fVar152 = fStack_c6c;
        fVar153 = fStack_c68;
        fVar154 = fStack_c64;
        fVar69 = local_c80;
        fVar117 = fStack_c7c;
        fVar123 = fStack_c78;
        fVar124 = fStack_c74;
        fVar45 = local_c90;
        fVar125 = fStack_c8c;
        fVar126 = fStack_c88;
        fVar127 = fStack_c84;
        fVar57 = local_ca0;
        fVar128 = fStack_c9c;
        fVar129 = fStack_c98;
        fVar135 = fStack_c94;
      } while (local_d80 != local_d78);
    }
LAB_0059fafe:
    bVar44 = local_d70 != &local_800;
    if (!bVar44) {
      return bVar44;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }